

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDateTime __thiscall QDateTime::addMSecs(QDateTime *this,qint64 msecs)

{
  bool bVar1;
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar2;
  TimeSpec TVar3;
  qint64 v1;
  Data *this_00;
  QDateTimePrivate *pQVar4;
  ulong uVar5;
  longlong in_RDX;
  Data *in_RSI;
  Data in_RDI;
  long in_FS_OFFSET;
  QDateTime *dt;
  QDateTimeData *in_stack_ffffffffffffff68;
  Data *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar6;
  Data *this_01;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RSI;
  local_10 = in_RDX;
  bVar1 = isValid((QDateTime *)&in_stack_ffffffffffffff70->data);
  if (!bVar1) {
    QDateTime((QDateTime *)0x571a8b);
    goto LAB_00571c76;
  }
  uVar6 = 0;
  *(undefined1 **)in_RDI.d = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime((QDateTime *)&in_stack_ffffffffffffff70->data,
            (QDateTime *)&in_stack_ffffffffffffff68->data);
  TVar3 = getSpec(in_stack_ffffffffffffff70);
  if (TVar3 != LocalTime) {
    if (TVar3 - UTC < 2) {
      this_00 = (Data *)getMSecs(in_stack_ffffffffffffff68);
      eVar2 = qAddOverflow<long_long>((longlong)this_00,local_10,&local_10);
      if (eVar2) {
        Data::invalidate(in_stack_ffffffffffffff70);
      }
      else {
        bVar1 = Data::isShort(in_RSI);
        if ((bVar1) && (bVar1 = msecsCanBeSmall((qint64)in_stack_ffffffffffffff70), bVar1)) {
          uVar5._0_4_ = *(QSharedData *)in_RDI;
          uVar5._4_4_ = *(StatusFlags *)((long)in_RDI + 4);
          uVar5 = uVar5 & 0xff | local_10 << 8;
          *(QSharedData *)in_RDI = (QSharedData)(int)uVar5;
          *(int *)((long)in_RDI + 4) = (int)(uVar5 >> 0x20);
        }
        else {
          Data::detach(this_00);
          pQVar4 = Data::operator->(in_RDI.d);
          pQVar4->m_msecs = local_10;
        }
      }
      goto LAB_00571c76;
    }
    if (TVar3 != TimeZone) goto LAB_00571c76;
  }
  v1 = toMSecsSinceEpoch((QDateTime *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98))
  ;
  eVar2 = qAddOverflow<long_long>(v1,local_10,&local_10);
  if (eVar2) {
    Data::invalidate(in_stack_ffffffffffffff70);
  }
  else {
    setMSecsSinceEpoch((QDateTime *)this_01,CONCAT17(uVar6,in_stack_ffffffffffffffd8));
  }
LAB_00571c76:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDateTime)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTime::addMSecs(qint64 msecs) const
{
    if (!isValid())
        return QDateTime();

    QDateTime dt(*this);
    switch (getSpec(d)) {
    case Qt::LocalTime:
    case Qt::TimeZone:
        // Convert to real UTC first in case this crosses a DST transition:
        if (!qAddOverflow(toMSecsSinceEpoch(), msecs, &msecs))
            dt.setMSecsSinceEpoch(msecs);
        else
            dt.d.invalidate();
        break;
    case Qt::UTC:
    case Qt::OffsetFromUTC:
        // No need to convert, just add on
        if (qAddOverflow(getMSecs(d), msecs, &msecs)) {
            dt.d.invalidate();
        } else if (d.isShort() && msecsCanBeSmall(msecs)) {
            dt.d.data.msecs = qintptr(msecs);
        } else {
            dt.d.detach();
            dt.d->m_msecs = msecs;
        }
        break;
    }
    return dt;
}